

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cc
# Opt level: O1

Expression __thiscall cnn::LSTMBuilder::add_input_impl(LSTMBuilder *this,int prev,Expression *x)

{
  float fVar1;
  byte bVar2;
  undefined8 *puVar3;
  long lVar4;
  LSTMBuilder *pLVar5;
  long *plVar6;
  undefined8 *in_RCX;
  long *plVar7;
  long lVar8;
  ulong uVar9;
  undefined4 in_register_00000034;
  long lVar10;
  bool bVar11;
  double __x;
  double __x_00;
  Expression EVar12;
  Expression in;
  Expression i_aot;
  Expression i_ot;
  Expression ph_t;
  Expression i_it;
  Expression i_awt;
  Expression i_ft;
  Expression i_ait;
  Expression i_wt;
  Expression local_1b8;
  long local_1a8;
  undefined1 local_1a0 [8];
  ulong local_198;
  uint local_18c;
  ComputationGraph local_188;
  undefined4 local_150;
  undefined8 local_148;
  undefined4 local_140;
  undefined8 local_138;
  undefined4 local_130;
  ComputationGraph *local_128;
  uint local_120;
  undefined8 local_118;
  ulong local_110;
  long local_108;
  long local_100;
  initializer_list<cnn::expr::Expression> local_f8;
  Expression local_e8;
  Expression local_d8;
  ComputationGraph *local_c8;
  uint local_c0;
  initializer_list<cnn::expr::Expression> local_b8;
  Expression local_a8;
  Expression local_98;
  LSTMBuilder *local_88;
  long local_80;
  long local_78;
  ulong local_70;
  Expression local_68;
  long *local_58;
  long *local_50;
  long local_48;
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  *local_40;
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  *local_38;
  
  lVar8 = CONCAT44(in_register_00000034,prev);
  local_18c = (uint)x;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)&local_188,
             (ulong)*(uint *)(lVar8 + 0xc0),(allocator_type *)&local_1b8);
  local_38 = (vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
              *)(lVar8 + 0x58);
  local_100 = lVar8;
  std::
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  ::emplace_back<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
            (local_38,(vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                      &local_188);
  if ((ComputationGraph *)
      local_188.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start != (ComputationGraph *)0x0) {
    operator_delete(local_188.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  lVar8 = local_100;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)&local_188,
             (ulong)*(uint *)(local_100 + 0xc0),(allocator_type *)&local_1b8);
  local_40 = (vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
              *)(lVar8 + 0x70);
  std::
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  ::emplace_back<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
            (local_40,(vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                      &local_188);
  local_88 = this;
  if ((ComputationGraph *)
      local_188.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start != (ComputationGraph *)0x0) {
    operator_delete(local_188.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  local_80 = *(long *)(local_100 + 0x60);
  local_1b8.pg = (ComputationGraph *)*in_RCX;
  local_1b8.i.t = *(uint *)(in_RCX + 1);
  if (*(int *)(local_100 + 0xc0) != 0) {
    local_50 = (long *)(local_100 + 0x90);
    local_58 = (long *)(local_100 + 0xa8);
    lVar10 = 0;
    local_48 = (ulong)local_18c << 3;
    lVar8 = 0;
    uVar9 = 0;
    local_108 = *(long *)(local_100 + 0x78);
    do {
      local_1a8 = *(long *)(local_100 + 0x40);
      local_98.pg = (ComputationGraph *)0x0;
      local_98.i.t = 0;
      bVar2 = *(byte *)(local_100 + 0x88);
      bVar11 = (int)local_18c < 0;
      if (bVar11) {
        plVar6 = local_58;
        plVar7 = local_50;
        if ((bVar2 & 1) != 0) goto LAB_0019950c;
        local_110 = 0;
        local_118 = 0;
      }
      else {
        plVar6 = (long *)(local_48 * 3 + *(long *)local_40);
        plVar7 = (long *)(*(long *)local_38 + local_48 * 3);
LAB_0019950c:
        local_118 = *(undefined8 *)(*plVar7 + lVar8);
        local_110 = (ulong)*(uint *)(*plVar7 + 8 + lVar8);
        local_98.pg = *(ComputationGraph **)(*plVar6 + lVar8);
        local_98.i.t = *(uint *)(*plVar6 + 8 + lVar8);
      }
      fVar1 = *(float *)(local_100 + 0xc4);
      local_78 = lVar8;
      local_70 = uVar9;
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        expr::dropout((expr *)&local_188,&local_1b8,fVar1);
        local_1b8.pg = (ComputationGraph *)
                       local_188.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        local_1b8.i.t =
             (uint)local_188.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      }
      local_a8.pg = (ComputationGraph *)0x0;
      local_a8.i.t = 0;
      if (bVar11 && (bVar2 & 1) == 0) {
        puVar3 = *(undefined8 **)(local_1a8 + lVar10);
        local_188.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)puVar3[6];
        local_188.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = *(uint *)(puVar3 + 7);
        local_188.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)*puVar3;
        local_188.parameter_nodes.
        super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)(puVar3 + 1);
        local_b8._M_len = 3;
      }
      else {
        puVar3 = *(undefined8 **)(local_1a8 + lVar10);
        local_188.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)puVar3[6];
        local_188.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = *(uint *)(puVar3 + 7);
        local_188.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)*puVar3;
        local_188.parameter_nodes.
        super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)(puVar3 + 1);
        local_188.ee = (ExecutionEngine *)puVar3[2];
        local_150 = *(undefined4 *)(puVar3 + 3);
        local_148 = local_118;
        local_140 = (undefined4)local_110;
        local_138 = puVar3[4];
        local_130 = *(undefined4 *)(puVar3 + 5);
        local_128 = local_98.pg;
        local_120 = local_98.i.t;
        local_b8._M_len = 7;
      }
      local_188.parameter_nodes.
      super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = local_1b8.i.t;
      local_188.parameter_nodes.
      super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_1b8.pg;
      local_b8._M_array = (iterator)&local_188;
      expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                ((detail *)&local_d8,&local_b8);
      local_a8.pg = local_d8.pg;
      local_a8.i.t = local_d8.i.t;
      expr::logistic((expr *)&local_d8,&local_a8);
      expr::operator-((expr *)&local_b8,1.0,&local_d8);
      local_c8 = (ComputationGraph *)0x0;
      local_c0 = 0;
      if (bVar11 && (bVar2 & 1) == 0) {
        lVar8 = *(long *)(local_1a8 + lVar10);
        local_188.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)(lVar8 + 0xa0);
        local_188.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = *(undefined4 *)(lVar8 + 0xa8);
        local_188.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar8 + 0x80);
        local_188.parameter_nodes.
        super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)(lVar8 + 0x88);
        local_198 = 3;
      }
      else {
        lVar8 = *(long *)(local_1a8 + lVar10);
        local_188.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)(lVar8 + 0xa0);
        local_188.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = *(undefined4 *)(lVar8 + 0xa8);
        local_188.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar8 + 0x80);
        local_188.parameter_nodes.
        super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)(lVar8 + 0x88);
        local_188.ee = *(ExecutionEngine **)(lVar8 + 0x90);
        local_150 = *(undefined4 *)(lVar8 + 0x98);
        local_148 = local_118;
        local_140 = (undefined4)local_110;
        local_198 = 5;
      }
      local_188.parameter_nodes.
      super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = local_1b8.i.t;
      local_188.parameter_nodes.
      super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_1b8.pg;
      local_1a0 = (undefined1  [8])&local_188;
      expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                ((detail *)&local_68,(initializer_list<cnn::expr::Expression> *)local_1a0);
      local_c8 = local_68.pg;
      local_c0 = local_68.i.t;
      expr::tanh((expr *)&local_68,__x);
      if (bVar11 && (bVar2 & 1) == 0) {
        expr::cwise_multiply((expr *)&local_188,&local_d8,&local_68);
        lVar8 = *(long *)(local_108 + -0x18);
        *(pointer *)(lVar8 + local_78) =
             local_188.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
             super__Vector_impl_data._M_start;
        *(uint *)(lVar8 + 8 + local_78) =
             (uint)local_188.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        expr::cwise_multiply((expr *)&local_188,&local_d8,&local_68);
        expr::cwise_multiply((expr *)local_1a0,(Expression *)&local_b8,&local_98);
        expr::operator+((expr *)&local_e8,(Expression *)local_1a0,(Expression *)&local_188);
        lVar8 = *(long *)(local_108 + -0x18);
        *(ComputationGraph **)(lVar8 + local_78) = local_e8.pg;
        *(uint *)(lVar8 + 8 + local_78) = local_e8.i.t;
      }
      lVar8 = local_78;
      local_1a0 = (undefined1  [8])0x0;
      local_198 = local_198 & 0xffffffff00000000;
      if (bVar11 && (bVar2 & 1) == 0) {
        lVar4 = *(long *)(local_1a8 + lVar10);
        local_188.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)(lVar4 + 0x70);
        local_188.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = *(uint *)(lVar4 + 0x78);
        local_188.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar4 + 0x40);
        local_188.parameter_nodes.
        super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)(lVar4 + 0x48);
        local_f8._M_len = 3;
      }
      else {
        lVar4 = *(long *)(local_1a8 + lVar10);
        local_188.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)(lVar4 + 0x70);
        local_188.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = *(uint *)(lVar4 + 0x78);
        local_188.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar4 + 0x40);
        local_188.parameter_nodes.
        super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)(lVar4 + 0x48);
        local_188.ee = *(ExecutionEngine **)(lVar4 + 0x50);
        local_150 = *(undefined4 *)(lVar4 + 0x58);
        local_148 = local_118;
        local_140 = (undefined4)local_110;
        local_138 = *(undefined8 *)(lVar4 + 0x60);
        local_130 = *(undefined4 *)(lVar4 + 0x68);
        local_128 = *(ComputationGraph **)(*(long *)(local_108 + -0x18) + local_78);
        local_120 = *(uint *)(*(long *)(local_108 + -0x18) + 8 + local_78);
        local_f8._M_len = 7;
      }
      local_188.parameter_nodes.
      super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = local_1b8.i.t;
      local_188.parameter_nodes.
      super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_1b8.pg;
      local_f8._M_array = (iterator)&local_188;
      expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                ((detail *)&local_e8,&local_f8);
      uVar9 = local_70;
      local_1a0 = (undefined1  [8])local_e8.pg;
      local_198 = CONCAT44(local_198._4_4_,local_e8.i.t);
      expr::logistic((expr *)&local_188,(Expression *)local_1a0);
      expr::tanh((expr *)&local_e8,__x_00);
      expr::cwise_multiply((expr *)&local_f8,(Expression *)&local_188,&local_e8);
      lVar4 = *(long *)(local_80 + -0x18);
      *(iterator *)(lVar4 + lVar8) = local_f8._M_array;
      *(uint *)(lVar4 + 8 + lVar8) = (uint)local_f8._M_len;
      local_1b8.pg = (ComputationGraph *)local_f8._M_array;
      local_1b8.i.t = (uint)local_f8._M_len;
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x10;
      lVar10 = lVar10 + 0x18;
    } while (uVar9 < *(uint *)(local_100 + 0xc0));
  }
  pLVar5 = local_88;
  fVar1 = *(float *)(local_100 + 0xc4);
  lVar8 = *(long *)(local_80 + -0x10);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    EVar12 = expr::dropout((expr *)local_88,(Expression *)(lVar8 + -0x10),fVar1);
    local_100 = EVar12._8_8_;
  }
  else {
    (local_88->super_RNNBuilder)._vptr_RNNBuilder = *(_func_int ***)(lVar8 + -0x10);
    (local_88->super_RNNBuilder).cur.t = *(int *)(lVar8 + -8);
  }
  EVar12._8_8_ = local_100;
  EVar12.pg = (ComputationGraph *)pLVar5;
  return EVar12;
}

Assistant:

Expression LSTMBuilder::add_input_impl(int prev, const Expression& x) {
  h.push_back(vector<Expression>(layers));
  c.push_back(vector<Expression>(layers));
  vector<Expression>& ht = h.back();
  vector<Expression>& ct = c.back();
  Expression in = x;
  for (unsigned i = 0; i < layers; ++i) {
    const vector<Expression>& vars = param_vars[i];
    Expression i_h_tm1, i_c_tm1;
    bool has_prev_state = (prev >= 0 || has_initial_state);
    if (prev < 0) {
      if (has_initial_state) {
        // intial value for h and c at timestep 0 in layer i
        // defaults to zero matrix input if not set in add_parameter_edges
        i_h_tm1 = h0[i];
        i_c_tm1 = c0[i];
      }
    } else {  // t > 0
      i_h_tm1 = h[prev][i];
      i_c_tm1 = c[prev][i];
    }
    // apply dropout according to http://arxiv.org/pdf/1409.2329v5.pdf
    if (dropout_rate) in = dropout(in, dropout_rate);
    // input
    Expression i_ait;
    if (has_prev_state)
      i_ait = affine_transform({vars[BI], vars[X2I], in, vars[H2I], i_h_tm1, vars[C2I], i_c_tm1});
    else
      i_ait = affine_transform({vars[BI], vars[X2I], in});
    Expression i_it = logistic(i_ait);
    // forget
    Expression i_ft = 1.f - i_it;
    // write memory cell
    Expression i_awt;
    if (has_prev_state)
      i_awt = affine_transform({vars[BC], vars[X2C], in, vars[H2C], i_h_tm1});
    else
      i_awt = affine_transform({vars[BC], vars[X2C], in});
    Expression i_wt = tanh(i_awt);
    // output
    if (has_prev_state) {
      Expression i_nwt = cwise_multiply(i_it,i_wt);
      Expression i_crt = cwise_multiply(i_ft,i_c_tm1);
      ct[i] = i_crt + i_nwt;
    } else {
      ct[i] = cwise_multiply(i_it,i_wt);
    }

    Expression i_aot;
    if (has_prev_state)
      i_aot = affine_transform({vars[BO], vars[X2O], in, vars[H2O], i_h_tm1, vars[C2O], ct[i]});
    else
      i_aot = affine_transform({vars[BO], vars[X2O], in});
    Expression i_ot = logistic(i_aot);
    Expression ph_t = tanh(ct[i]);
    in = ht[i] = cwise_multiply(i_ot,ph_t);
  }
  if (dropout_rate) return dropout(ht.back(), dropout_rate);
    else return ht.back();
}